

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptOperators::OrdinaryCreateFromConstructor
          (RecyclableObject *constructor,RecyclableObject *obj,DynamicObject *intrinsicProto,
          ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  DynamicObject *pDVar7;
  Var local_40;
  Var value;
  
  GetProperty_InternalSimple(constructor,constructor,0x124,&local_40,scriptContext);
  if (local_40 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    value = intrinsicProto;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00ac0e35;
    *puVar5 = 0;
  }
  else {
    if (((ulong)local_40 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)local_40 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (bVar3) {
        *puVar5 = 0;
        return obj;
      }
      goto LAB_00ac0e35;
    }
    value = intrinsicProto;
    if ((ulong)local_40 >> 0x32 != 0 || ((ulong)local_40 & 0xffff000000000000) == 0x1000000000000) {
      return obj;
    }
  }
  pRVar6 = UnsafeVarTo<Js::RecyclableObject>(local_40);
  if (pRVar6 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00ac0e35;
    *puVar5 = 0;
  }
  TVar1 = ((pRVar6->type).ptr)->typeId;
  if ((int)TVar1 < 0x58) {
    if ((int)TVar1 < 0x17) {
      return obj;
    }
  }
  else {
    BVar4 = RecyclableObject::IsExternal(pRVar6);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00ac0e35:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  pDVar7 = VarTo<Js::DynamicObject>(local_40);
  if (pDVar7 != (DynamicObject *)value) {
    pRVar6 = VarTo<Js::RecyclableObject>(local_40);
    JavascriptObject::ChangePrototype(obj,pRVar6,true,scriptContext);
  }
  return obj;
}

Assistant:

RecyclableObject* JavascriptOperators::OrdinaryCreateFromConstructor(RecyclableObject* constructor, RecyclableObject* obj, DynamicObject* intrinsicProto, ScriptContext* scriptContext)
    {
        // There isn't a good way for us to add internal properties to objects in Chakra.
        // Thus, caller should take care to create obj with the correct internal properties.

        Var proto = JavascriptOperators::GetPropertyNoCache(constructor, Js::PropertyIds::prototype, scriptContext);

        // If constructor.prototype is an object, we should use that as the [[Prototype]] for our obj.
        // Else, we set the [[Prototype]] internal slot of obj to %intrinsicProto% - which should be the default.
        if (JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(proto)) &&
            VarTo<DynamicObject>(proto) != intrinsicProto)
        {
            JavascriptObject::ChangePrototype(obj, VarTo<RecyclableObject>(proto), /*validate*/true, scriptContext);
        }

        return obj;
    }